

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  int iVar1;
  int *piVar2;
  int newSize;
  int *tmp;
  int val_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->spaceMax <= ctxt->spaceNr) {
    iVar1 = xmlGrowCapacity(ctxt->spaceMax,4,10,1000000000);
    if (iVar1 < 0) {
      xmlErrMemory(ctxt);
      return -1;
    }
    piVar2 = (int *)(*xmlRealloc)(ctxt->spaceTab,(long)iVar1 << 2);
    if (piVar2 == (int *)0x0) {
      xmlErrMemory(ctxt);
      return -1;
    }
    ctxt->spaceTab = piVar2;
    ctxt->spaceMax = iVar1;
  }
  ctxt->spaceTab[ctxt->spaceNr] = val;
  ctxt->space = ctxt->spaceTab + ctxt->spaceNr;
  iVar1 = ctxt->spaceNr;
  ctxt->spaceNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->spaceMax, sizeof(tmp[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlErrMemory(ctxt);
	    return(-1);
        }

        tmp = xmlRealloc(ctxt->spaceTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt);
	    return(-1);
	}
	ctxt->spaceTab = tmp;

        ctxt->spaceMax = newSize;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}